

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O0

int __thiscall
bwtil::fid_cgap::select
          (fid_cgap *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  value_type vVar1;
  ulint uVar2;
  int iVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  __last;
  fid_cgap *__writefds_00;
  difference_type dVar4;
  size_type __n;
  reference pvVar5;
  reference this_00;
  fd_set *__readfds_00;
  undefined4 in_register_00000034;
  ulong uVar6;
  ulint q_m;
  ulint q_r;
  ulint q_l;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff78;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff80;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_ffffffffffffff88;
  fid_cgap *__val;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  in_stack_ffffffffffffffa8;
  
  uVar6 = CONCAT44(in_register_00000034,__nfds);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&this->SEL,uVar6 / this->t)
  ;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->R_1);
  __last._M_current = (unsigned_long *)(uVar6 / this->t + 1);
  __writefds_00 =
       (fid_cgap *)std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->SEL);
  __val = this;
  if (__last._M_current < __writefds_00) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
              (&this->SEL,uVar6 / this->t + 1);
    __writefds_00 = this;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  operator+(in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  __gnu_cxx::
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>::
  operator+(in_stack_ffffffffffffff88,(difference_type)in_stack_ffffffffffffff80);
  ::std::
  upper_bound<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
            (in_stack_ffffffffffffffa8,__last,&__val->W);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(in_stack_ffffffffffffff78);
  dVar4 = __gnu_cxx::operator-
                    (in_stack_ffffffffffffff80,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)in_stack_ffffffffffffff78);
  __n = dVar4 - 1;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&__val->V_select,__n);
  vVar1 = *pvVar5;
  uVar2 = __val->v;
  this_00 = std::vector<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>::operator[]
                      (&__val->BSDs,__n);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&__val->R_1,__n);
  iVar3 = bsd_cgap::select(this_00,(int)uVar6 - (int)*pvVar5,__readfds_00,(fd_set *)__writefds_00,
                           __exceptfds,__timeout);
  return (int)vVar1 * (int)uVar2 + iVar3;
}

Assistant:

ulint select(ulint i){

		assert(t>0);
		assert(n>0);
		assert(u>0);

		assert(i<n);

		ulint q_l = SEL[i/t];
		ulint q_r = R_1.size();

		if(i/t+1<SEL.size())
			q_r = SEL[i/t+1]+1;

		//i-th bit set is among V-marked blocks q_l,...,q_r
		//note that |{q_l,...,q_r}| <= t, so following binary search costs log t

		assert(q_l<R_1.size());

		ulint q_m = (std::upper_bound(R_1.begin()+q_l,R_1.begin()+q_r,i) - R_1.begin()) - 1;

		assert(R_1[q_m]<=i);

		assert(q_m+1 == R_1.size() || R_1[q_m+1]>i);

		assert(q_m<V_select.size());

		//now V_select[q_m] is the block containing the i-th set bit

		assert(q_m<BSDs.size());
		assert(q_m<R_1.size());
		assert(i>=R_1[q_m]);

		assert(i-R_1[q_m]<BSDs[q_m].number_of_1());

		return V_select[q_m]*v + BSDs[q_m].select(i-R_1[q_m]);

	}